

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

int __thiscall QPDF::findPage(QPDF *this,QPDFObjGen og)

{
  bool bVar1;
  int iVar2;
  pointer pMVar3;
  QPDFExc *this_00;
  element_type *peVar4;
  undefined4 extraout_var;
  reference ppVar5;
  allocator<char> local_89;
  string local_88;
  QPDF *local_68;
  allocator<char> local_49;
  string local_48;
  _Self local_28;
  _Self local_20;
  iterator it;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  it._M_node = (_Base_ptr)this;
  this_local = (QPDF *)og;
  flattenPagesTree(this);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
       ::find(&pMVar3->pageobj_to_pages_pos,(key_type *)&this_local);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
       ::end(&pMVar3->pageobj_to_pages_pos);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_int>_>::operator*(&local_20);
    return ppVar5->second;
  }
  QTC::TC("qpdf","QPDF_pages findPage not found",0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"page object",&local_49);
  local_68 = this_local;
  setLastObjectDescription(this,&local_48,(QPDFObjGen)this_local);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar3->file);
  iVar2 = (*peVar4->_vptr_InputSource[3])();
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"page object not referenced in /Pages tree",&local_89);
  QPDFExc::QPDFExc(this_00,qpdf_e_pages,(string *)CONCAT44(extraout_var,iVar2),
                   &pMVar3->last_object_description,0,&local_88);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

int
QPDF::findPage(QPDFObjGen og)
{
    flattenPagesTree();
    auto it = m->pageobj_to_pages_pos.find(og);
    if (it == m->pageobj_to_pages_pos.end()) {
        QTC::TC("qpdf", "QPDF_pages findPage not found");
        setLastObjectDescription("page object", og);
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            m->last_object_description,
            0,
            "page object not referenced in /Pages tree");
    }
    return (*it).second;
}